

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
BeliefValue::GetValues(BeliefSetNonStationary *Beliefs,QFunctionsDiscreteNonStationary *Q)

{
  vector<double,_std::allocator<double>_> *this;
  vector<double,_std::allocator<double>_> *pvVar1;
  BeliefSetNonStationary *pBVar2;
  reference pvVar3;
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  *in_RDX;
  vector<double,_std::allocator<double>_> *in_RDI;
  QFunctionsDiscrete *in_stack_00000020;
  BeliefSet *in_stack_00000028;
  Index k;
  vector<double,_std::allocator<double>_> valuesT;
  Index t;
  Index i;
  vector<double,_std::allocator<double>_> *values;
  value_type in_stack_ffffffffffffff68;
  BeliefSetNonStationary *in_stack_ffffffffffffff70;
  allocator_type *in_stack_ffffffffffffff80;
  vector<double,_std::allocator<double>_> *this_00;
  uint local_54;
  vector<double,_std::allocator<double>_> local_50;
  uint local_34;
  uint local_30;
  undefined1 local_19;
  vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
  *local_18;
  
  local_19 = 0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  BeliefSetNonStationary::Size((BeliefSetNonStationary *)in_stack_ffffffffffffff80);
  std::allocator<double>::allocator((allocator<double> *)0x8fed22);
  std::vector<double,_std::allocator<double>_>::vector
            (this_00,(size_type)in_RDI,in_stack_ffffffffffffff80);
  std::allocator<double>::~allocator((allocator<double> *)0x8fed42);
  local_30 = 0;
  local_34 = 0;
  while( true ) {
    this = (vector<double,_std::allocator<double>_> *)(ulong)local_34;
    pvVar1 = (vector<double,_std::allocator<double>_> *)
             std::
             vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
             ::size(local_18);
    if (this == pvVar1) break;
    BeliefSetNonStationary::Get
              (in_stack_ffffffffffffff70,(Index)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    std::
    vector<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
    ::operator[](local_18,(ulong)local_34);
    GetValues(in_stack_00000028,in_stack_00000020);
    local_54 = 0;
    while( true ) {
      in_stack_ffffffffffffff70 = (BeliefSetNonStationary *)(ulong)local_54;
      pBVar2 = (BeliefSetNonStationary *)
               std::vector<double,_std::allocator<double>_>::size(&local_50);
      if (in_stack_ffffffffffffff70 == pBVar2) break;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,(ulong)local_54);
      in_stack_ffffffffffffff68 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(ulong)local_30);
      *pvVar3 = in_stack_ffffffffffffff68;
      local_30 = local_30 + 1;
      local_54 = local_54 + 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector(this);
    local_34 = local_34 + 1;
  }
  return in_RDI;
}

Assistant:

vector<double> BeliefValue::GetValues(const BeliefSetNonStationary &Beliefs,
                                      const QFunctionsDiscreteNonStationary &Q)
{
    vector<double> values(Beliefs.Size());
    Index i=0;
    for(Index t=0;t!=Q.size();++t)
    {
        vector<double> valuesT=GetValues(Beliefs.Get(t),
                                         Q[t]);
        for(Index k=0;k!=valuesT.size();++k)
        {
            values[i]=valuesT[k];
            i++;
        }
    }
    return(values);
}